

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.h
# Opt level: O2

string * pybind11::type_id<pybind11::str>(void)

{
  string *in_RDI;
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"N8pybind113strE",&local_19);
  detail::clean_type_id(in_RDI);
  return in_RDI;
}

Assistant:

static std::string type_id() {
    std::string name(typeid(T).name());
    detail::clean_type_id(name);
    return name;
}